

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O3

bool __thiscall cppurses::Event::send_to_all_filters(Event *this)

{
  Widget *pWVar1;
  int iVar2;
  _Rb_tree_node_base *p_Var3;
  
  pWVar1 = this->receiver_;
  p_Var3 = (pWVar1->event_filters_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var3 == &(pWVar1->event_filters_)._M_t._M_impl.super__Rb_tree_header) {
      return false;
    }
    if ((*(char *)(*(long *)(p_Var3 + 1) + 0x328) == '\x01') &&
       (iVar2 = (*this->_vptr_Event[3])(this), (char)iVar2 != '\0')) break;
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  }
  return true;
}

Assistant:

auto Event::send_to_all_filters() const -> bool
{
    auto const& filters = receiver_.get_event_filters();
    for (Widget* filter : filters) {
        if (filter->enabled() && this->filter_send(*filter))
            return true;
    }
    return false;
}